

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
* __thiscall
libtorrent::aux::torrent::get_piece_layers
          (vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
           *__return_storage_ptr__,torrent *this)

{
  pointer pmVar1;
  pointer this_00;
  _Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_> _Stack_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pmVar1 = (this->m_merkle_trees).
           super_vector<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>
           .
           super__Vector_base<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->m_merkle_trees).
                 super_vector<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>
                 .
                 super__Vector_base<libtorrent::aux::merkle_tree,_std::allocator<libtorrent::aux::merkle_tree>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pmVar1; this_00 = this_00 + 1
      ) {
    merkle_tree::get_piece_layer((vector<sha256_hash> *)&_Stack_38,this_00);
    ::std::
    vector<std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>,std::allocator<std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>>
    ::
    emplace_back<libtorrent::aux::container_wrapper<libtorrent::digest32<256l>,int,std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>>
              ((vector<std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>,std::allocator<std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>>
                *)__return_storage_ptr__,
               (container_wrapper<libtorrent::digest32<256L>,_int,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
                *)&_Stack_38);
    ::std::_Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>::
    ~_Vector_base(&_Stack_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<sha256_hash>> torrent::get_piece_layers() const
	{
		std::vector<std::vector<sha256_hash>> ret;
		for (auto const& tree : m_merkle_trees)
			ret.emplace_back(tree.get_piece_layer());
		return ret;
	}